

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O3

void printCCOperand(MCInst *MI,int opNum,SStream *O)

{
  int iVar1;
  uint uVar2;
  MCOperand *op;
  int64_t iVar3;
  char *s;
  arm64_cc aVar4;
  
  op = MCInst_getOperand(MI,opNum);
  iVar3 = MCOperand_getImm(op);
  iVar1 = (int)iVar3;
  aVar4 = iVar1 + 0x100;
  uVar2 = MCInst_getOpcode(MI);
  if ((int)uVar2 < 0x146) {
    if (((0x3d < uVar2 - 0x95) || ((0x2000008800000003U >> ((ulong)(uVar2 - 0x95) & 0x3f) & 1) == 0)
        ) && (3 < uVar2 - 0x4d)) goto LAB_001bb939;
  }
  else if ((4 < uVar2 - 0x1d8) && (1 < uVar2 - 0x146)) goto LAB_001bb939;
  if (iVar1 < 0x10) {
    aVar4 = iVar1 + 0x110;
  }
LAB_001bb939:
  if (aVar4 - 0x100 < 0x20) {
    s = &DAT_0024adac + *(int *)(&DAT_0024adac + (ulong)(aVar4 - 0x100) * 4);
  }
  else {
    s = (char *)0x0;
  }
  SStream_concat0(O,s);
  if (MI->csh->detail != CS_OPT_OFF) {
    (MI->flat_insn->detail->field_6).arm64.cc = aVar4;
  }
  return;
}

Assistant:

static void printCCOperand(MCInst *MI, int opNum, SStream *O)
{
	int CC = (int)MCOperand_getImm(MCInst_getOperand(MI, opNum)) + 256;

	switch (MCInst_getOpcode(MI)) {
		default: break;
		case SP_FBCOND:
		case SP_FBCONDA:
		case SP_BPFCC:
		case SP_BPFCCA:
		case SP_BPFCCNT:
		case SP_BPFCCANT:
		case SP_MOVFCCrr:  case SP_V9MOVFCCrr:
		case SP_MOVFCCri:  case SP_V9MOVFCCri:
		case SP_FMOVS_FCC: case SP_V9FMOVS_FCC:
		case SP_FMOVD_FCC: case SP_V9FMOVD_FCC:
		case SP_FMOVQ_FCC: case SP_V9FMOVQ_FCC:
				 // Make sure CC is a fp conditional flag.
				 CC = (CC < 16+256) ? (CC + 16) : CC;
				 break;
	}

	SStream_concat0(O, SPARCCondCodeToString((sparc_cc)CC));

	if (MI->csh->detail)
		MI->flat_insn->detail->sparc.cc = (sparc_cc)CC;
}